

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Abc_NtkDfsOne_rec(Abc_Obj_t *pObj,Vec_Int_t *vTfi,int nLevelMin,int CiLabel)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pObj_00;
  int local_44;
  int local_34;
  int i;
  Abc_Obj_t *pFanin;
  int CiLabel_local;
  int nLevelMin_local;
  Vec_Int_t *vTfi_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsCi(pObj);
    if ((iVar1 == 0) &&
       ((iVar1 = Abc_ObjLevel(pObj), nLevelMin <= iVar1 ||
        (iVar1 = Abc_ObjFaninNum(pObj), iVar1 < 1)))) {
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x593,"int Abc_NtkDfsOne_rec(Abc_Obj_t *, Vec_Int_t *, int, int)");
      }
      iVar1 = Abc_ObjFaninNum(pObj);
      local_44 = CiLabel;
      if (iVar1 != 0) {
        local_44 = 0;
      }
      (pObj->field_6).iTemp = local_44;
      for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_34 < iVar1; local_34 = local_34 + 1) {
        pObj_00 = Abc_ObjFanin(pObj,local_34);
        uVar2 = Abc_NtkDfsOne_rec(pObj_00,vTfi,nLevelMin,CiLabel);
        (pObj->field_6).iTemp = uVar2 | (pObj->field_6).iTemp;
      }
      uVar2 = Abc_ObjId(pObj);
      Vec_IntPush(vTfi,uVar2);
      Sfm_ObjSimulateNode(pObj);
      pObj_local._4_4_ = (pObj->field_6).iTemp;
    }
    else {
      uVar2 = Abc_ObjId(pObj);
      Vec_IntPush(vTfi,uVar2);
      (pObj->field_6).iTemp = CiLabel;
      pObj_local._4_4_ = CiLabel;
    }
  }
  else {
    pObj_local._4_4_ = (pObj->field_6).iTemp;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_NtkDfsOne_rec( Abc_Obj_t * pObj, Vec_Int_t * vTfi, int nLevelMin, int CiLabel )
{
    Abc_Obj_t * pFanin; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return pObj->iTemp;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) )
    {
        Vec_IntPush( vTfi, Abc_ObjId(pObj) );
        return (pObj->iTemp = CiLabel);
    }
    assert( Abc_ObjIsNode(pObj) );
    pObj->iTemp = Abc_ObjFaninNum(pObj) ? 0 : CiLabel;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        pObj->iTemp |= Abc_NtkDfsOne_rec( pFanin, vTfi, nLevelMin, CiLabel );
    Vec_IntPush( vTfi, Abc_ObjId(pObj) );
    Sfm_ObjSimulateNode( pObj );
    return pObj->iTemp;
}